

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O0

TestOneof2_NestedMessage * __thiscall
proto2_unittest::TestOneof2_NestedMessage::_internal_mutable_child(TestOneof2_NestedMessage *this)

{
  Arena *arena;
  TestOneof2_NestedMessage *pTVar1;
  TestOneof2_NestedMessage *p;
  TestOneof2_NestedMessage *this_local;
  
  if ((this->field_0)._impl_.child_ == (TestOneof2_NestedMessage *)0x0) {
    arena = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    pTVar1 = (TestOneof2_NestedMessage *)
             google::protobuf::Arena::DefaultConstruct<proto2_unittest::TestOneof2_NestedMessage>
                       (arena);
    (this->field_0)._impl_.child_ = pTVar1;
  }
  return (this->field_0)._impl_.child_;
}

Assistant:

inline ::proto2_unittest::TestOneof2_NestedMessage* PROTOBUF_NONNULL TestOneof2_NestedMessage::_internal_mutable_child() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.child_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::proto2_unittest::TestOneof2_NestedMessage>(GetArena());
    _impl_.child_ = reinterpret_cast<::proto2_unittest::TestOneof2_NestedMessage*>(p);
  }
  return _impl_.child_;
}